

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O0

ostream * tcu::Format::operator<<(ostream *str,Array<long_*> *fmt)

{
  long *local_20;
  long *cur;
  Array<long_*> *fmt_local;
  ostream *str_local;
  
  std::operator<<(str,"{ ");
  for (local_20 = fmt->begin; local_20 != fmt->end; local_20 = local_20 + 1) {
    if (local_20 != fmt->begin) {
      std::operator<<(str,", ");
    }
    std::ostream::operator<<(str,*local_20);
  }
  std::operator<<(str," }");
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}